

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O0

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint *puVar9;
  void *pvVar10;
  byte bVar11;
  ulong in_RSI;
  uint *in_RDI;
  mchunkptr r_2;
  mchunkptr p_3;
  size_t rsize_2;
  size_t dvs;
  mchunkptr r_1;
  mchunkptr p_2;
  size_t rsize_1;
  mchunkptr F_2;
  mchunkptr B;
  bindex_t I;
  mchunkptr DV;
  size_t DVS;
  mchunkptr F_1;
  bindex_t i;
  binmap_t leftbits;
  size_t rsize;
  mchunkptr r;
  mchunkptr p_1;
  mchunkptr b_1;
  mchunkptr F;
  mchunkptr p;
  mchunkptr b;
  binmap_t smallbits;
  bindex_t idx;
  size_t nb;
  void *mem;
  mstate ms;
  ulong local_f8;
  size_t in_stack_ffffffffffffff18;
  mstate in_stack_ffffffffffffff20;
  uint *local_b8;
  size_t in_stack_ffffffffffffff58;
  mstate in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff98;
  mstate in_stack_ffffffffffffffa0;
  ulong local_30;
  void *local_8;
  
  if (in_RSI < 0xf1) {
    if (in_RSI < 0x17) {
      local_f8 = 0x20;
    }
    else {
      local_f8 = in_RSI + 0xf & 0xfffffffffffffff8;
    }
    local_30 = local_f8;
    bVar11 = (byte)(local_f8 >> 3);
    uVar4 = *in_RDI >> (bVar11 & 0x1f);
    if ((uVar4 & 3) != 0) {
      lVar5 = (ulong)((uVar4 ^ 0xffffffff) & 1) + (local_f8 >> 3);
      puVar6 = in_RDI + lVar5 * 4 + 0xe;
      lVar1 = *(long *)(puVar6 + 4);
      puVar9 = *(uint **)(lVar1 + 0x10);
      if (puVar6 == puVar9) {
        *in_RDI = (1 << ((byte)lVar5 & 0x1f) ^ 0xffffffffU) & *in_RDI;
      }
      else {
        *(uint **)(puVar6 + 4) = puVar9;
        *(uint **)(puVar9 + 6) = puVar6;
      }
      *(ulong *)(lVar1 + 8) = lVar5 * 8 | 3;
      *(ulong *)(lVar1 + 8 + lVar5 * 8) = *(ulong *)(lVar1 + 8 + lVar5 * 8) | 1;
      return (void *)(lVar1 + 0x10);
    }
    if (local_f8 <= *(ulong *)(in_RDI + 2)) goto LAB_0017ff26;
    if (uVar4 != 0) {
      uVar3 = 0;
      for (uVar4 = uVar4 << (bVar11 & 0x1f) &
                   ((1 << (bVar11 & 0x1f)) << 1 | ((1 << (bVar11 & 0x1f)) << 1 ^ 0xffffffffU) + 1);
          (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
        uVar3 = uVar3 + 1;
      }
      uVar8 = (ulong)uVar3;
      puVar6 = in_RDI + uVar8 * 4 + 0xe;
      lVar1 = *(long *)(puVar6 + 4);
      puVar9 = *(uint **)(lVar1 + 0x10);
      if (puVar6 == puVar9) {
        *in_RDI = (1 << ((byte)uVar3 & 0x1f) ^ 0xffffffffU) & *in_RDI;
      }
      else {
        *(uint **)(puVar6 + 4) = puVar9;
        *(uint **)(puVar9 + 6) = puVar6;
      }
      uVar7 = uVar8 * 8 - local_f8;
      if (uVar7 < 0x20) {
        *(ulong *)(lVar1 + 8) = uVar8 << 3 | 3;
        *(ulong *)(lVar1 + 8 + uVar8 * 8) = *(ulong *)(lVar1 + 8 + uVar8 * 8) | 1;
      }
      else {
        *(ulong *)(lVar1 + 8) = local_f8 | 3;
        lVar5 = lVar1 + local_f8;
        *(ulong *)(lVar5 + 8) = uVar7 | 1;
        *(ulong *)(lVar5 + uVar7) = uVar7;
        if (*(ulong *)(in_RDI + 2) != 0) {
          lVar2 = *(long *)(in_RDI + 6);
          uVar8 = *(ulong *)(in_RDI + 2) >> 3;
          puVar9 = in_RDI + uVar8 * 4 + 0xe;
          bVar11 = (byte)uVar8;
          if ((*in_RDI & 1 << (bVar11 & 0x1f)) == 0) {
            *in_RDI = 1 << (bVar11 & 0x1f) | *in_RDI;
            local_b8 = puVar9;
          }
          else {
            local_b8 = *(uint **)(puVar9 + 4);
          }
          *(long *)(puVar9 + 4) = lVar2;
          *(long *)(local_b8 + 6) = lVar2;
          *(uint **)(lVar2 + 0x10) = local_b8;
          *(uint **)(lVar2 + 0x18) = puVar9;
        }
        *(ulong *)(in_RDI + 2) = uVar7;
        *(long *)(in_RDI + 6) = lVar5;
      }
      return (void *)(lVar1 + 0x10);
    }
    if (in_RDI[1] == 0) goto LAB_0017ff26;
    pvVar10 = tmalloc_small(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  else {
    if (0xffffffffffffff7f < in_RSI) {
      local_30 = 0xffffffffffffffff;
      goto LAB_0017ff26;
    }
    local_30 = in_RSI + 0xf & 0xfffffffffffffff8;
    if (in_RDI[1] == 0) goto LAB_0017ff26;
    pvVar10 = tmalloc_large(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  if (pvVar10 != (void *)0x0) {
    return pvVar10;
  }
LAB_0017ff26:
  if (*(ulong *)(in_RDI + 2) < local_30) {
    if (local_30 < *(ulong *)(in_RDI + 4)) {
      lVar1 = *(long *)(in_RDI + 4);
      *(ulong *)(in_RDI + 4) = lVar1 - local_30;
      lVar5 = *(long *)(in_RDI + 8);
      *(ulong *)(in_RDI + 8) = lVar5 + local_30;
      *(ulong *)(lVar5 + local_30 + 8) = lVar1 - local_30 | 1;
      *(ulong *)(lVar5 + 8) = local_30 | 3;
      local_8 = (void *)(lVar5 + 0x10);
    }
    else {
      local_8 = alloc_sys(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  else {
    uVar8 = *(long *)(in_RDI + 2) - local_30;
    lVar1 = *(long *)(in_RDI + 6);
    if (uVar8 < 0x20) {
      uVar8 = *(ulong *)(in_RDI + 2);
      in_RDI[2] = 0;
      in_RDI[3] = 0;
      in_RDI[6] = 0;
      in_RDI[7] = 0;
      *(ulong *)(lVar1 + 8) = uVar8 | 3;
      *(ulong *)(lVar1 + 8 + uVar8) = *(ulong *)(lVar1 + 8 + uVar8) | 1;
    }
    else {
      lVar5 = lVar1 + local_30;
      *(long *)(in_RDI + 6) = lVar5;
      *(ulong *)(in_RDI + 2) = uVar8;
      *(ulong *)(lVar5 + 8) = uVar8 | 1;
      *(ulong *)(lVar5 + uVar8) = uVar8;
      *(ulong *)(lVar1 + 8) = local_30 | 3;
    }
    local_8 = (void *)(lVar1 + 0x10);
  }
  return local_8;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}